

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckIntegerWrapDecoration
          (ValidationState_t *vstate,Instruction *inst,Decoration *decoration)

{
  Op OVar1;
  Decoration DVar2;
  DiagnosticStream *pDVar3;
  char *local_210;
  char *local_208;
  DiagnosticStream local_200;
  Decoration *local_28;
  Decoration *decoration_local;
  Instruction *inst_local;
  ValidationState_t *vstate_local;
  
  local_28 = decoration;
  decoration_local = (Decoration *)inst;
  inst_local = (Instruction *)vstate;
  OVar1 = Instruction::opcode(inst);
  if (OVar1 != OpExtInst) {
    if ((((OVar1 == OpSNegate) || (OVar1 == OpIAdd)) || (OVar1 == OpISub)) ||
       ((OVar1 == OpIMul || (OVar1 == OpShiftLeftLogical)))) {
      return SPV_SUCCESS;
    }
    if (OVar1 != OpExtInstWithForwardRefsKHR) {
      ValidationState_t::diag
                (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)decoration_local);
      DVar2 = Decoration::dec_type(local_28);
      local_208 = "NoUnsignedWrap";
      if (DVar2 == DecorationNoSignedWrap) {
        local_208 = "NoSignedWrap";
      }
      pDVar3 = DiagnosticStream::operator<<(&local_200,&local_208);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(char (*) [35])" decoration may not be applied to ");
      OVar1 = Instruction::opcode((Instruction *)decoration_local);
      local_210 = spvOpcodeString(OVar1);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_210);
      vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_200);
      return vstate_local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t CheckIntegerWrapDecoration(ValidationState_t& vstate,
                                        const Instruction& inst,
                                        const Decoration& decoration) {
  switch (inst.opcode()) {
    case spv::Op::OpIAdd:
    case spv::Op::OpISub:
    case spv::Op::OpIMul:
    case spv::Op::OpShiftLeftLogical:
    case spv::Op::OpSNegate:
      return SPV_SUCCESS;
    case spv::Op::OpExtInst:
    case spv::Op::OpExtInstWithForwardRefsKHR:
      // TODO(dneto): Only certain extended instructions allow these
      // decorations.  For now allow anything.
      return SPV_SUCCESS;
    default:
      break;
  }

  return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
         << (decoration.dec_type() == spv::Decoration::NoSignedWrap
                 ? "NoSignedWrap"
                 : "NoUnsignedWrap")
         << " decoration may not be applied to "
         << spvOpcodeString(inst.opcode());
}